

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_pow.c
# Opt level: O3

word zzPowerModW(word a,word b,word mod,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  size_t sVar19;
  word wVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  
  if (b == 0) {
    wVar20 = 1;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = a;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = a;
    uVar16 = __umodti3(SUB168(auVar1 * auVar8,0),SUB168(auVar1 * auVar8,8),mod,0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar16;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = a;
    uVar17 = __umodti3(SUB168(auVar2 * auVar9,0),SUB168(auVar2 * auVar9,8),mod,0);
    *(ulong *)((long)stack + 8) = uVar17;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar17;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar16;
    uVar17 = __umodti3(SUB168(auVar3 * auVar10,0),SUB168(auVar3 * auVar10,8),mod,0);
    *(ulong *)((long)stack + 0x10) = uVar17;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar17;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar16;
    uVar18 = __umodti3(SUB168(auVar4 * auVar11,0),SUB168(auVar4 * auVar11,8),mod,0);
    *(undefined8 *)((long)stack + 0x18) = uVar18;
    *(word *)stack = a;
    sVar19 = u64CLZ(b);
    uVar17 = 0x40 - sVar19;
    uVar16 = 3;
    if (uVar17 < 3) {
      uVar16 = uVar17;
    }
    uVar23 = (uint)(b >> ((char)uVar17 - (byte)uVar16 & 0x3f)) & ~(-1 << ((byte)uVar16 & 0x1f));
    uVar17 = (ulong)uVar23;
    uVar21 = uVar17;
    if ((uVar23 & 1) == 0) {
      do {
        uVar21 = uVar17 >> 1;
        uVar16 = uVar16 - 1;
        uVar22 = uVar17 & 2;
        uVar17 = uVar21;
      } while (uVar22 == 0);
    }
    wVar20 = *(word *)((long)stack + (uVar21 & 0xfffffffffffffffe) * 4);
    if (sVar19 + uVar16 != 0x40) {
      uVar16 = 0x3f - (sVar19 + uVar16);
      do {
        if ((b >> (uVar16 & 0x3f) & 1) == 0) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = wVar20;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = wVar20;
          wVar20 = __umodti3(SUB168(auVar5 * auVar12,0),SUB168(auVar5 * auVar12,8),mod,0);
          uVar16 = uVar16 - 1;
        }
        else {
          uVar17 = uVar16 + 1;
          uVar21 = 3;
          if (uVar17 < 3) {
            uVar21 = uVar17;
          }
          uVar23 = (int)uVar17 - (int)uVar21;
          uVar22 = (ulong)((uint)(b >> ((byte)uVar23 & 0x3f)) & ~(-1 << ((byte)uVar21 & 0x1f)));
          uVar17 = uVar22;
          if ((b >> ((ulong)uVar23 & 0x3f) & 1) == 0) {
            do {
              uVar22 = uVar17 >> 1;
              uVar21 = uVar21 - 1;
              uVar15 = uVar17 & 2;
              uVar17 = uVar22;
            } while (uVar15 == 0);
            uVar16 = uVar16 - uVar21;
            if (uVar21 != 0) goto LAB_001361f5;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = wVar20;
          }
          else {
            uVar16 = uVar16 - uVar21;
LAB_001361f5:
            auVar24._8_8_ = 0;
            auVar24._0_8_ = wVar20;
            do {
              uVar17 = auVar24._0_8_;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = uVar17;
              auVar13._8_8_ = 0;
              auVar13._0_8_ = uVar17;
              auVar24 = __umodti3(SUB168(auVar6 * auVar13,0),
                                  auVar24._8_8_ * uVar17 + SUB168(auVar6 * auVar13,8),mod,0);
              uVar21 = uVar21 - 1;
            } while (uVar21 != 0);
          }
          uVar17 = *(ulong *)((long)stack + (uVar22 & 0xfffffffffffffffe) * 4);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = auVar24._0_8_;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar17;
          wVar20 = __umodti3(SUB168(auVar7 * auVar14,0),
                             auVar24._8_8_ * uVar17 + SUB168(auVar7 * auVar14,8),mod,0);
        }
      } while (uVar16 != 0xffffffffffffffff);
    }
  }
  return wVar20;
}

Assistant:

word zzPowerModW(register word a, register word b, register word mod, 
	void* stack)
{
	register dword prod;
	register word slide;
	register size_t pos;
	register size_t slide_size;
	// переменные в stack
	word* powers;	/* [4]powers */
	// pre
	ASSERT(mod != 0);
	// b == 0?
	if (b == 0)
		return 1;
	// раскладка stack
	powers = (word*)stack;
	// powers <- малые нечетные степени a
	prod = a;
	prod *= a, prod %= mod, powers[0] = (word)prod;
	prod *= a, prod %= mod, powers[1] = (word)prod;
	prod *= powers[0], prod %= mod, powers[2] = (word)prod;
	prod *= powers[0], prod %= mod, powers[3] = (word)prod;
	powers[0] = a;
	// pos <- номер старшего единичного бита b
	pos = B_PER_W - 1 - wordCLZ(b);
	// slide <- старший слайд b
	slide_size = MIN2(pos + 1, 3);
	slide = b >> (pos + 1 - slide_size);
	slide &= WORD_BIT_POS(slide_size) - 1;
	for (; slide % 2 == 0; slide >>= 1, slide_size--);
	// a <- powers[slide / 2]
	a = powers[slide / 2];
	pos -= slide_size;
	// пробегаем биты b
	while (pos != SIZE_MAX)
	{
		prod = a;
		if ((b & WORD_BIT_POS(pos)) == 0)
		{
			// a <- a^2 \mod mod
			prod *= a, a = prod % mod;
			--pos;
		}
		else
		{
			// slide <- очередной слайд b
			slide_size = MIN2(pos + 1, 3);
			slide = b >> (pos + 1 - slide_size);
			slide &= WORD_BIT_POS(slide_size) - 1;
			for (; slide % 2 == 0; slide >>= 1, slide_size--);
			pos -= slide_size;
			// a <- a^2 \mod mod
			while (slide_size--)
				prod *= a, prod %= mod, a = (word)prod;
			// a <- a * powers[slide / 2] \mod mod
			prod *= powers[slide / 2];
			prod %= mod;
			a = (word)prod;
		}
	}
	// выход
	prod = 0, slide = b = mod = 0, pos = slide_size = 0;
	return a;
}